

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall Lowerer::LowerArrayDetachedCheck(Lowerer *this,Instr *instr)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar5;
  Opnd *this_01;
  LabelInstr *target;
  LabelInstr *instr_00;
  
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar3 = JITTimeFunctionBody::IsAsmJsMode(this_00);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x26b0,"(m_func->GetJITFunctionBody()->IsAsmJsMode())",
                       "m_func->GetJITFunctionBody()->IsAsmJsMode()");
    if (!bVar3) goto LAB_005b41ca;
    *puVar5 = 0;
  }
  pIVar1 = instr->m_prev;
  this_01 = IR::Instr::UnlinkSrc1(instr);
  OVar4 = IR::Opnd::GetKind(this_01);
  if (OVar4 != OpndKindIndir) {
    OVar4 = IR::Opnd::GetKind(this_01);
    if (OVar4 != OpndKindMemRef) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x26b4,"(isDetachedOpnd->IsIndirOpnd() || isDetachedOpnd->IsMemRefOpnd())"
                         ,"isDetachedOpnd->IsIndirOpnd() || isDetachedOpnd->IsMemRefOpnd()");
      if (!bVar3) {
LAB_005b41ca:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
  }
  target = InsertLabel(false,instr->m_next);
  instr_00 = IR::LabelInstr::New(Label,instr->m_func,true);
  IR::Instr::InsertBefore(instr,&instr_00->super_Instr);
  InsertTest(this_01,this_01,&instr_00->super_Instr);
  InsertBranch(BrNotNeq_A,false,target,&instr_00->super_Instr);
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,instr,HelperOp_OutOfMemoryError,(LabelInstr *)0x0,(Opnd *)0x0,
             (PropertySymOpnd *)0x0,false);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerArrayDetachedCheck(IR::Instr * instr)
{
    // TEST isDetached, isDetached
    // JE Done
    // Helper:
    // CALL Js::Throw::OutOfMemory
    // Done:

    Assert(m_func->GetJITFunctionBody()->IsAsmJsMode());
    IR::Instr * instrPrev = instr->m_prev;

    IR::Opnd * isDetachedOpnd = instr->UnlinkSrc1();
    Assert(isDetachedOpnd->IsIndirOpnd() || isDetachedOpnd->IsMemRefOpnd());

    IR::LabelInstr * doneLabel = InsertLabel(false, instr->m_next);
    IR::LabelInstr * helperLabel = InsertLabel(true, instr);

    InsertTestBranch(isDetachedOpnd, isDetachedOpnd, Js::OpCode::BrNotNeq_A, doneLabel, helperLabel);

    m_lowererMD.ChangeToHelperCall(instr, IR::HelperOp_OutOfMemoryError);

    return instrPrev;
}